

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O3

void cmInstallGenerator::AddTweak
               (ostream *os,Indent indent,string *config,string *file,TweakMethod *tweak)

{
  ostream *poVar1;
  Indent IVar2;
  string tws;
  ostringstream tw;
  cmScriptGeneratorIndent local_1c8;
  undefined4 uStack_1c4;
  long local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1c8.Level = indent.Level + 2;
  if ((tweak->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*tweak->_M_invoker)
            ((_Any_data *)tweak,(basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&local_1c8
             ,config,file);
  std::__cxx11::stringbuf::str();
  if (local_1c0 != 0) {
    IVar2.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar2.Level = IVar2.Level + -1;
      } while (IVar2.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"if(EXISTS \"",0xb);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" AND\n",6);
    IVar2.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
        IVar2.Level = IVar2.Level + -1;
      } while (IVar2.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"   NOT IS_SYMLINK \"",0x13);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(char *)CONCAT44(uStack_1c4,local_1c8.Level),local_1c0);
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        indent.Level = indent.Level + -1;
      } while (indent.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  }
  if ((long *)CONCAT44(uStack_1c4,local_1c8.Level) != local_1b8) {
    operator_delete((long *)CONCAT44(uStack_1c4,local_1c8.Level),local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void cmInstallGenerator::AddTweak(std::ostream& os, Indent indent,
                                  const std::string& config,
                                  std::string const& file,
                                  const TweakMethod& tweak)
{
  std::ostringstream tw;
  tweak(tw, indent.Next(), config, file);
  std::string tws = tw.str();
  if (!tws.empty()) {
    os << indent << "if(EXISTS \"" << file << "\" AND\n"
       << indent << "   NOT IS_SYMLINK \"" << file << "\")\n";
    os << tws;
    os << indent << "endif()\n";
  }
}